

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O1

int crazyRead(void *context,char *buffer,int len)

{
  char *pcVar1;
  int iVar2;
  clock_t cVar3;
  size_t sVar4;
  int iVar5;
  ulong __n;
  
  __n = 0xffffffff;
  if (len < 0 || (buffer == (char *)0x0 || context == (void *)0x0)) goto LAB_00102ee3;
  cVar3 = clock();
  if ((2999999 < cVar3 - t0) && (timeout = 1, instate == 1)) {
    crazyRead_cold_1();
  }
  pcVar1 = current;
  iVar2 = rlen;
  if (instate == 2) {
    iVar5 = rlen - len;
    if (iVar5 != 0 && len <= rlen) {
LAB_00103000:
      memcpy(buffer,current,(ulong)(uint)len);
      current = pcVar1 + (uint)len;
      __n = (ulong)(uint)len;
      rlen = iVar5;
      goto LAB_00102ee3;
    }
    sVar4 = (size_t)rlen;
    rlen = 0;
    memcpy(buffer,current,sVar4);
    instate = 3;
  }
  else {
    if (instate == 1) {
      __n = 0x1000;
      if (len < 0x1000) {
        __n = (ulong)(uint)len;
      }
      memcpy(buffer,filling,__n);
      pcVar1 = crazy;
      curlen = curlen + __n;
      if (maxlen <= curlen) {
        sVar4 = strlen(crazy);
        rlen = (int)sVar4 - crazy_indx;
        current = pcVar1 + crazy_indx;
        instate = 2;
      }
      goto LAB_00102ee3;
    }
    __n = 0;
    if (instate != 0) goto LAB_00102ee3;
    iVar5 = rlen - len;
    if (iVar5 != 0 && len <= rlen) goto LAB_00103000;
    sVar4 = (size_t)rlen;
    rlen = 0;
    memcpy(buffer,current,sVar4);
    instate = 1;
  }
  __n = (ulong)(uint)iVar2;
  curlen = 0;
LAB_00102ee3:
  return (int)__n;
}

Assistant:

static int
crazyRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if ((check_time() <= 0) && (instate == 1)) {
        fprintf(stderr, "\ntimeout in crazy(%d)\n", crazy_indx);
        rlen = strlen(crazy) - crazy_indx;
        current = &crazy[crazy_indx];
        instate = 2;
    }
    if (instate == 0) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 1;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 2) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 3;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 1) {
        if (len > CHUNK) len = CHUNK;
        memcpy(buffer, &filling[0], len);
        curlen += len;
        if (curlen >= maxlen) {
            rlen = strlen(crazy) - crazy_indx;
            current = &crazy[crazy_indx];
            instate = 2;
        }
    } else
      len = 0;
    return (len);
}